

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

first_of_any_result __thiscall
c4::basic_substring<char_const>::first_of_any_iter<c4::basic_substring<char_const>*>
          (basic_substring<char_const> *this,basic_substring<const_char> *first_span,
          basic_substring<const_char> *last_span)

{
  code *pcVar1;
  bool bVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  basic_substring<const_char> *pbVar7;
  first_of_any_result fVar8;
  ulong local_38;
  
  uVar4 = *(ulong *)(this + 8);
  uVar5 = 0xffffffffffffffff;
  if (uVar4 == 0) {
    sVar3 = 0xffffffffffffffff;
  }
  else {
    uVar5 = 0;
    do {
      if (first_span != last_span) {
        sVar3 = 0;
        pbVar7 = first_span;
        do {
          uVar4 = pbVar7->len;
          if (uVar4 + uVar5 <= *(ulong *)(this + 8)) {
            if (uVar4 == 0) goto LAB_0023e270;
            uVar6 = 0;
            while( true ) {
              if (*(ulong *)(this + 8) <= uVar5 + uVar6) {
                first_of_any_iter<c4::basic_substring<char_const>*>();
                uVar4 = local_38;
              }
              if (uVar4 <= uVar6) {
                if ((((byte)s_error_flags & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
                  pcVar1 = (code *)swi(3);
                  fVar8 = (first_of_any_result)(*pcVar1)();
                  return fVar8;
                }
                handle_error(0x24bbea,
                             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                             ,0x14c4,"i >= 0 && i < len");
              }
              if (*(char *)(uVar6 + *(long *)this + uVar5) != pbVar7->str[uVar6]) break;
              uVar6 = uVar6 + 1;
              uVar4 = pbVar7->len;
              if (uVar4 <= uVar6) goto LAB_0023e270;
            }
          }
          sVar3 = sVar3 + 1;
          pbVar7 = pbVar7 + 1;
        } while (pbVar7 != last_span);
        uVar4 = *(ulong *)(this + 8);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < uVar4);
    sVar3 = 0xffffffffffffffff;
    uVar5 = 0xffffffffffffffff;
  }
LAB_0023e270:
  fVar8.pos = uVar5;
  fVar8.which = sVar3;
  return fVar8;
}

Assistant:

first_of_any_result first_of_any_iter(It first_span, It last_span) const
    {
        for(size_t i = 0; i < len; ++i)
        {
            size_t curr = 0;
            for(It it = first_span; it != last_span; ++curr, ++it)
            {
                auto const& chars = *it;
                if((i + chars.len) > len) continue;
                bool gotit = true;
                for(size_t j = 0; j < chars.len; ++j)
                {
                    C4_ASSERT(i + j < len);
                    if(str[i + j] != chars[j])
                    {
                        gotit = false;
                        break;
                    }
                }
                if(gotit)
                {
                    return {curr, i};
                }
            }
        }
        return {NONE, npos};
    }